

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

bool __thiscall cppcms::xss::uri_parser::dec_octet(uri_parser *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = 0;
  iVar3 = 0;
  while( true ) {
    if (this->begin_ == this->end_) {
      return false;
    }
    bVar1 = *this->begin_;
    if ((9 < (byte)(bVar1 - 0x30)) || (2 < uVar2)) break;
    uVar2 = uVar2 + 1;
    iVar3 = iVar3 * 10 + (uint)bVar1 + -0x30;
  }
  if (uVar2 == 0) {
    return false;
  }
  if (iVar3 < 10 && uVar2 != 1) {
    return false;
  }
  return iVar3 < 0x100 && (uVar2 == 2 || 99 < iVar3);
}

Assistant:

save_point(uri_parser *self) : 
				self_(self) ,
				sp_(self_->begin_)
			{
			}